

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmfilegen.cpp
# Opt level: O0

void randomize_list(read_list_t *read_list,ui32_t check_total)

{
  undefined4 uVar1;
  undefined8 uVar2;
  ui32_t uVar3;
  uint uVar4;
  read_list_t t;
  ui32_t i;
  ui32_t j;
  ui32_t check_total_local;
  read_list_t *read_list_local;
  
  for (t.position._4_4_ = 0; t.position._4_4_ < check_total; t.position._4_4_ = t.position._4_4_ + 1
      ) {
    if (3 < randomize_list::seq) {
      randomize_list::seq = 0;
    }
    if (randomize_list::seq == 0) {
      Kumu::FortunaRNG::FillRandom(&s_RNG,0x10e2a0);
    }
    uVar3 = randomize_list::seq + 1;
    uVar4 = randomize_list::tmp_ints[randomize_list::seq] % (check_total - 1);
    randomize_list::seq = uVar3;
    if (uVar4 != t.position._4_4_) {
      uVar2 = *(undefined8 *)(read_list + uVar4);
      uVar1 = *(undefined4 *)((long)&read_list[uVar4].position + 4);
      *(undefined8 *)(read_list + uVar4) = *(undefined8 *)(read_list + t.position._4_4_);
      *(undefined4 *)((long)&read_list[uVar4].position + 4) =
           *(undefined4 *)((long)&read_list[t.position._4_4_].position + 4);
      *(undefined8 *)(read_list + t.position._4_4_) = uVar2;
      *(undefined4 *)((long)&read_list[t.position._4_4_].position + 4) = uVar1;
    }
  }
  return;
}

Assistant:

void
randomize_list(read_list_t* read_list, ui32_t check_total)
{
  static ui32_t tmp_ints[4];
  static ui32_t seq = 0;

  for ( ui32_t j = 0; j < check_total; j++ )
    {
      if ( seq > 3 )
	seq = 0;

      if ( seq == 0 )
	s_RNG.FillRandom((byte_t*)tmp_ints, 16);

      ui32_t i = tmp_ints[seq++] % (check_total - 1);

      if ( i == j )
	continue;

      read_list_t t = read_list[i];
      read_list[i] = read_list[j];
      read_list[j] = t;
    }
}